

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void drawSceneNodeRecursive(cgltf_node *node,mat4 *viewProj,mat4 *parentMat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  uint uVar23;
  GLuint GVar24;
  cgltf_mesh *pcVar25;
  cgltf_accessor *pcVar26;
  void *pvVar27;
  mat4 *pmVar28;
  cgltf_texture *pcVar29;
  cgltf_node **ppcVar30;
  cgltf_node *node_00;
  uint skinning;
  cgltf_size cVar31;
  PFNGLDRAWARRAYSPROC p_Var32;
  PFNGLDRAWELEMENTSPROC p_Var33;
  PFNGLUNIFORM4FVPROC p_Var34;
  GLenum GVar35;
  GLenum GVar36;
  ShaderData *pSVar37;
  GLuint *pGVar38;
  char *__function;
  mat4 *extraout_RDX;
  mat4 *extraout_RDX_00;
  mat4 *extraout_RDX_01;
  long lVar39;
  cgltf_material *pcVar40;
  cgltf_attribute **ppcVar41;
  GLuint GVar42;
  ulong uVar43;
  float *pfVar44;
  long lVar45;
  float *pfVar46;
  mat4 *pmVar47;
  long lVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  mat3 modelMat3;
  mat4 modelViewProj;
  mat4 jointMatrices [64];
  GLsizei local_1270;
  float local_1234;
  float local_1230;
  float local_122c;
  float local_1228;
  float local_1224;
  float local_1220;
  float local_121c;
  float local_1218;
  float local_1214;
  cgltf_skin *local_1210;
  float local_1208;
  float fStack_1204;
  float fStack_1200;
  float fStack_11fc;
  float local_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float local_11e8;
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  undefined4 uStack_1194;
  undefined4 uStack_1190;
  undefined4 uStack_118c;
  undefined1 local_1188 [16];
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined8 local_1158;
  undefined8 uStack_1150;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined8 local_1128;
  undefined8 uStack_1120;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  GLfloat local_1038 [14];
  float afStack_1000 [1012];
  
  uVar43 = (ulong)((int)((ulong)((long)node - (long)parsedData->nodes) >> 3) * 0x684bda13);
  if (DAT_003e8940 <= uVar43) {
LAB_00115e06:
    __assert_fail("i < _size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/vector.hpp"
                  ,0x2c,
                  "T &tl::Vector<glm::mat<4, 4, float>>::operator[](size_t) [T = glm::mat<4, 4, float>]"
                 );
  }
  pcVar25 = node->mesh;
  if (pcVar25 != (cgltf_mesh *)0x0) {
    pfVar44 = (float *)(uVar43 * 0x40 + anims::nodesMatrices);
    local_1210 = node->skin;
    local_1234 = *pfVar44;
    if (local_1210 == (cgltf_skin *)0x0) {
      local_1270 = 0;
    }
    else {
      local_1270 = (GLsizei)local_1210->joints_count;
      lVar45 = local_1210->joints_count << 0x20;
      if (lVar45 != 0) {
        fVar53 = pfVar44[1];
        fVar55 = pfVar44[2];
        fVar82 = pfVar44[4];
        fVar78 = pfVar44[5];
        fVar79 = pfVar44[6];
        fVar81 = pfVar44[8];
        fVar1 = pfVar44[9];
        fVar2 = pfVar44[10];
        fStack_11e4 = fVar78 * fVar2 - fVar79 * fVar1;
        fVar83 = fVar53 * fVar2 - fVar55 * fVar1;
        fVar56 = fVar53 * fVar79 - fVar55 * fVar78;
        fVar49 = 1.0 / (fVar81 * fVar56 + (local_1234 * fStack_11e4 - fVar83 * fVar82));
        fVar56 = fVar56 * fVar49;
        fVar63 = -(fVar79 * local_1234 - fVar55 * fVar82) * fVar49;
        fVar80 = (local_1234 * fVar78 - fVar53 * fVar82) * fVar49;
        local_1188 = ZEXT416((uint)fVar56);
        fVar3 = pfVar44[0xc];
        fVar4 = pfVar44[0xd];
        local_11f8 = -fVar83 * fVar49;
        fStack_11e4 = fStack_11e4 * fVar49;
        local_11e8 = (fVar2 * local_1234 - fVar55 * fVar81) * fVar49;
        fStack_11f4 = -(fVar82 * fVar2 - fVar79 * fVar81) * fVar49;
        fStack_11f0 = fVar49 * 0.0;
        fStack_11ec = fVar49 * -0.0;
        local_1208 = fVar49 * -(fVar1 * local_1234 - fVar81 * fVar53);
        fStack_1204 = fVar49 * (fVar82 * fVar1 - fVar78 * fVar81);
        fStack_1200 = fVar49 * -0.0;
        fStack_11fc = fVar49 * 0.0;
        fVar53 = pfVar44[0xe];
        local_11a8 = (fVar3 * -local_11f8 - fVar4 * local_11e8) - fVar53 * local_1208;
        fStack_11a4 = (fVar3 * -fStack_11e4 - fVar4 * fStack_11f4) - fVar53 * fStack_1204;
        fStack_11a0 = (fVar3 * -(fVar49 * -0.0) - fVar4 * fStack_11f0) - fVar53 * fStack_1200;
        fStack_119c = (fVar3 * -(fVar49 * 0.0) - fVar4 * fStack_11ec) - fVar53 * fStack_11fc;
        lVar45 = lVar45 >> 0x20;
        local_1198 = (-fVar56 * fVar3 - fVar4 * fVar63) - fVar80 * fVar53;
        uStack_1194 = 0x80000000;
        uStack_1190 = 0x80000000;
        uStack_118c = 0x80000000;
        local_11c8 = ZEXT416((uint)fVar63);
        local_11b8 = ZEXT416((uint)fVar80);
        pfVar46 = afStack_1000;
        uVar43 = 0;
        do {
          pcVar26 = local_1210->inverse_bind_matrices;
          fStack_11e0 = fStack_11f0;
          fStack_11dc = fStack_11ec;
          local_11d8 = fStack_11f4;
          fStack_11d4 = local_11f8;
          fStack_11d0 = fStack_11f0;
          fStack_11cc = fStack_11ec;
          if (pcVar26->count <= uVar43) {
            __assert_fail("i < a.count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.hpp"
                          ,0x54,
                          "const void *cgltfAccessAccessor(const cgltf_accessor &, cgltf_size)");
          }
          lVar39 = (long)local_1210->joints[uVar43] - (long)parsedData->nodes >> 3;
          if (DAT_003e8940 <= (ulong)(lVar39 * -0x7b425ed097b425ed)) goto LAB_00115e06;
          lVar39 = lVar39 * 0x2f684bda12f684c0;
          fVar53 = *(float *)(anims::nodesMatrices + 0xc + lVar39);
          fVar55 = *(float *)(anims::nodesMatrices + 0x1c + lVar39);
          fVar82 = *(float *)(anims::nodesMatrices + 0x2c + lVar39);
          fVar78 = *(float *)(anims::nodesMatrices + 0x10 + lVar39);
          fVar79 = *(float *)(anims::nodesMatrices + lVar39);
          fVar81 = *(float *)(anims::nodesMatrices + 4 + lVar39);
          fVar1 = *(float *)(anims::nodesMatrices + 8 + lVar39);
          local_1088 = CONCAT44(fVar79,fVar78);
          uStack_1080 = 0;
          fVar2 = *(float *)(anims::nodesMatrices + 0x14 + lVar39);
          local_1098 = CONCAT44(fVar81,fVar2);
          uStack_1090 = 0;
          fVar3 = *(float *)(anims::nodesMatrices + 0x18 + lVar39);
          local_10a8 = CONCAT44(fVar1,fVar3);
          uStack_10a0 = 0;
          uVar14 = *(undefined8 *)(anims::nodesMatrices + 0x20 + lVar39);
          fVar64 = (float)uVar14;
          fVar66 = (float)((ulong)uVar14 >> 0x20);
          fVar52 = local_1198 * fVar55 + fVar80 * fVar3 + fVar63 * fVar2 + fVar56 * fVar78;
          fVar54 = fVar53 + fVar1 * 0.0 + fVar81 * 0.0 + fVar79 * 0.0;
          fVar68 = local_1198 * fVar53 + fVar80 * fVar1 + fVar63 * fVar81 + fVar56 * fVar79;
          fVar69 = fVar55 + fVar3 * 0.0 + fVar2 * 0.0 + fVar78 * 0.0;
          local_10b8 = *(float *)(anims::nodesMatrices + 0x28 + lVar39);
          local_10c8 = *(undefined8 *)(anims::nodesMatrices + 0x30 + lVar39);
          fVar65 = (float)local_10c8;
          fVar67 = (float)((ulong)local_10c8 >> 0x20);
          uStack_10c0 = 0;
          fVar74 = local_1198 * fVar82 + fVar80 * local_10b8 + fVar64 * fVar56 + fVar63 * fVar66;
          fVar75 = fVar82 + local_10b8 * 0.0 + fVar66 * 0.0 + fVar64 * 0.0;
          fVar76 = local_10b8 * 0.0 + 0.0 + -0.0;
          fVar77 = local_10b8 * 0.0 + 0.0 + 0.0;
          local_10d8 = *(float *)(anims::nodesMatrices + 0x38 + lVar39);
          fVar4 = *(float *)(anims::nodesMatrices + 0x3c + lVar39);
          local_10e8 = ZEXT416((uint)fVar4);
          fVar70 = local_1198 * fVar4 + fVar80 * local_10d8 + fVar56 * fVar65 + fVar63 * fVar67;
          fVar71 = fVar4 + local_10d8 * 0.0 + fVar67 * 0.0 + fVar65 * 0.0;
          fVar72 = local_10d8 * 0.0 + 0.0 + -0.0;
          fVar73 = local_10d8 * 0.0 + 0.0 + 0.0;
          pvVar27 = pcVar26->buffer_view->buffer->data;
          lVar39 = pcVar26->offset + pcVar26->buffer_view->offset;
          lVar48 = pcVar26->stride * uVar43;
          uVar14 = *(undefined8 *)((long)pvVar27 + lVar48 + lVar39);
          fVar57 = (float)uVar14;
          fVar60 = (float)((ulong)uVar14 >> 0x20);
          local_10f8 = CONCAT44(fVar57,fVar60);
          uStack_10f0 = 0;
          local_1108 = *(float *)((long)pvVar27 + lVar48 + 8 + lVar39);
          local_1178 = *(float *)((long)pvVar27 + lVar48 + 0xc + lVar39);
          local_1118 = fVar70 * local_1178 + fVar74 * local_1108 + fVar68 * fVar57 + fVar52 * fVar60
          ;
          fStack_1114 = fVar71 * local_1178 +
                        fVar75 * local_1108 + fVar69 * fVar60 + fVar54 * fVar57;
          fStack_1110 = fVar72 * local_1178 + fVar76 * local_1108 + 0.0;
          fStack_110c = fVar73 * local_1178 + fVar77 * local_1108 + 0.0;
          uVar14 = *(undefined8 *)((long)pvVar27 + lVar48 + 0x10 + lVar39);
          fVar58 = (float)uVar14;
          fVar61 = (float)((ulong)uVar14 >> 0x20);
          local_1128 = CONCAT44(fVar58,fVar61);
          uStack_1120 = 0;
          local_1138 = *(float *)((long)pvVar27 + lVar48 + 0x18 + lVar39);
          fVar49 = *(float *)((long)pvVar27 + lVar48 + 0x1c + lVar39);
          local_1148 = fVar70 * fVar49 + fVar74 * local_1138 + fVar68 * fVar58 + fVar52 * fVar61;
          fStack_1144 = fVar71 * fVar49 + fVar75 * local_1138 + fVar69 * fVar61 + fVar54 * fVar58;
          fStack_1140 = fVar72 * fVar49 + fVar76 * local_1138 + 0.0;
          fStack_113c = fVar73 * fVar49 + fVar77 * local_1138 + 0.0;
          uVar14 = *(undefined8 *)((long)pvVar27 + lVar48 + 0x20 + lVar39);
          fVar59 = (float)uVar14;
          fVar62 = (float)((ulong)uVar14 >> 0x20);
          local_1158 = CONCAT44(fVar59,fVar62);
          uStack_1150 = 0;
          fVar83 = *(float *)((long)pvVar27 + lVar48 + 0x28 + lVar39);
          fVar5 = *(float *)((long)pvVar27 + lVar48 + 0x2c + lVar39);
          local_1168 = fVar70 * fVar5 + fVar74 * fVar83 + fVar68 * fVar59 + fVar52 * fVar62;
          fStack_1164 = fVar71 * fVar5 + fVar75 * fVar83 + fVar69 * fVar62 + fVar54 * fVar59;
          fStack_1160 = fVar72 * fVar5 + fVar76 * fVar83 + 0.0;
          fStack_115c = fVar73 * fVar5 + fVar77 * fVar83 + 0.0;
          fVar50 = fVar53 * local_11a8 +
                   fVar1 * local_1208 + fVar81 * local_11e8 + fVar79 * local_11f8;
          fVar51 = fVar55 * fStack_11a4 +
                   fVar3 * fStack_1204 + fVar2 * fStack_11f4 + fVar78 * fStack_11e4;
          uVar14 = *(undefined8 *)((long)pvVar27 + lVar48 + 0x30 + lVar39);
          fVar76 = (float)uVar14;
          fVar77 = (float)((ulong)uVar14 >> 0x20);
          fVar72 = *(float *)((long)pvVar27 + lVar48 + 0x38 + lVar39);
          fVar73 = *(float *)((long)pvVar27 + lVar48 + 0x3c + lVar39);
          fVar78 = fVar55 * local_11a8 +
                   fVar3 * local_1208 + fVar2 * local_11e8 + fVar78 * local_11f8;
          fVar79 = fVar53 * fStack_11a4 +
                   fVar1 * fStack_1204 + fVar81 * fStack_11f4 + fVar79 * fStack_11e4;
          fVar81 = fVar66 * local_11e8 + local_11f8 * fVar64 + local_10b8 * local_1208 +
                   fVar82 * local_11a8;
          fVar82 = fVar64 * fStack_11e4 + fStack_11f4 * fVar66 + local_10b8 * fStack_1204 +
                   fVar82 * fStack_11a4;
          fVar53 = fVar67 * local_11e8 + fVar65 * local_11f8 + local_10d8 * local_1208 +
                   fVar4 * local_11a8;
          fVar55 = fVar65 * fStack_11e4 + fVar67 * fStack_11f4 + local_10d8 * fStack_1204 +
                   fVar4 * fStack_11a4;
          pfVar46[-0xe] =
               local_1178 * fVar55 + local_1108 * fVar82 + fVar57 * fVar79 + fVar60 * fVar51;
          pfVar46[-0xd] =
               local_1178 * fVar53 + local_1108 * fVar81 + fVar60 * fVar78 + fVar57 * fVar50;
          pfVar46[-0xc] = local_1118;
          pfVar46[-0xb] = fStack_1114;
          pfVar46[-10] = fVar49 * fVar55 + local_1138 * fVar82 + fVar58 * fVar79 + fVar61 * fVar51;
          pfVar46[-9] = fVar49 * fVar53 + local_1138 * fVar81 + fVar61 * fVar78 + fVar58 * fVar50;
          pfVar46[-8] = local_1148;
          pfVar46[-7] = fStack_1144;
          pfVar46[-6] = fVar5 * fVar55 + fVar83 * fVar82 + fVar59 * fVar79 + fVar62 * fVar51;
          pfVar46[-5] = fVar5 * fVar53 + fVar83 * fVar81 + fVar62 * fVar78 + fVar59 * fVar50;
          pfVar46[-4] = local_1168;
          pfVar46[-3] = fStack_1164;
          pfVar46[-2] = fVar55 * fVar73 + fVar82 * fVar72 + fVar79 * fVar76 + fVar51 * fVar77;
          pfVar46[-1] = fVar53 * fVar73 + fVar81 * fVar72 + fVar78 * fVar77 + fVar50 * fVar76;
          *pfVar46 = fVar70 * fVar73 + fVar74 * fVar72 + fVar68 * fVar76 + fVar52 * fVar77;
          pfVar46[1] = fVar71 * fVar73 + fVar75 * fVar72 + fVar69 * fVar77 + fVar54 * fVar76;
          uVar43 = uVar43 + 1;
          pfVar46 = pfVar46 + 0x10;
          fStack_1174 = local_1178;
          fStack_1170 = local_1178;
          fStack_116c = local_1178;
          fStack_1134 = local_1138;
          fStack_1130 = local_1138;
          fStack_112c = local_1138;
          fStack_1104 = local_1108;
          fStack_1100 = local_1108;
          fStack_10fc = local_1108;
          fStack_10d4 = local_10d8;
          fStack_10d0 = local_10d8;
          fStack_10cc = local_10d8;
          fStack_10b4 = local_10b8;
          fStack_10b0 = local_10b8;
          fStack_10ac = local_10b8;
        } while (lVar45 + (ulong)(lVar45 == 0) != uVar43);
        local_1234 = *pfVar44;
      }
    }
    local_1230 = pfVar44[1];
    local_122c = pfVar44[2];
    local_1228 = pfVar44[4];
    local_1224 = pfVar44[5];
    local_1220 = pfVar44[6];
    local_121c = pfVar44[8];
    local_1218 = pfVar44[9];
    local_1214 = pfVar44[10];
    uVar6 = viewProj->value[0].field_0;
    uVar15 = viewProj->value[0].field_1;
    uVar7 = viewProj->value[1].field_0;
    uVar16 = viewProj->value[1].field_1;
    uVar8 = viewProj->value[2].field_0;
    uVar17 = viewProj->value[2].field_1;
    uVar9 = viewProj->value[3].field_0;
    uVar18 = viewProj->value[3].field_1;
    fVar53 = pfVar44[3];
    local_1078 = (float)uVar9 * fVar53 +
                 (float)uVar8 * local_122c + (float)uVar7 * local_1230 + (float)uVar6 * local_1234;
    fStack_1074 = (float)uVar18 * fVar53 +
                  (float)uVar17 * local_122c +
                  (float)uVar16 * local_1230 + (float)uVar15 * local_1234;
    uVar10 = viewProj->value[0].field_2;
    uVar19 = viewProj->value[0].field_3;
    uVar11 = viewProj->value[1].field_2;
    uVar20 = viewProj->value[1].field_3;
    uVar12 = viewProj->value[2].field_2;
    uVar21 = viewProj->value[2].field_3;
    uVar13 = viewProj->value[3].field_2;
    uVar22 = viewProj->value[3].field_3;
    fStack_1070 = fVar53 * (float)uVar13 +
                  local_122c * (float)uVar12 +
                  local_1230 * (float)uVar11 + local_1234 * (float)uVar10;
    fStack_106c = fVar53 * (float)uVar22 +
                  local_122c * (float)uVar21 +
                  local_1230 * (float)uVar20 + local_1234 * (float)uVar19;
    fVar53 = pfVar44[7];
    fVar55 = pfVar44[0xb];
    fVar82 = pfVar44[0xc];
    fVar78 = pfVar44[0xd];
    fVar79 = pfVar44[0xe];
    fVar81 = pfVar44[0xf];
    local_1068 = (float)uVar9 * fVar53 +
                 (float)uVar8 * local_1220 + (float)uVar7 * local_1224 + (float)uVar6 * local_1228;
    fStack_1064 = (float)uVar18 * fVar53 +
                  (float)uVar17 * local_1220 +
                  (float)uVar16 * local_1224 + (float)uVar15 * local_1228;
    fStack_1060 = fVar53 * (float)uVar13 +
                  local_1220 * (float)uVar12 +
                  local_1224 * (float)uVar11 + local_1228 * (float)uVar10;
    fStack_105c = fVar53 * (float)uVar22 +
                  local_1220 * (float)uVar21 +
                  local_1224 * (float)uVar20 + local_1228 * (float)uVar19;
    local_1058 = (float)uVar9 * fVar55 +
                 (float)uVar8 * local_1214 + (float)uVar7 * local_1218 + (float)uVar6 * local_121c;
    fStack_1054 = (float)uVar18 * fVar55 +
                  (float)uVar17 * local_1214 +
                  (float)uVar16 * local_1218 + (float)uVar15 * local_121c;
    fStack_1050 = fVar55 * (float)uVar13 +
                  local_1214 * (float)uVar12 +
                  local_1218 * (float)uVar11 + local_121c * (float)uVar10;
    fStack_104c = fVar55 * (float)uVar22 +
                  local_1214 * (float)uVar21 +
                  local_1218 * (float)uVar20 + local_121c * (float)uVar19;
    local_1048 = (float)uVar9 * fVar81 +
                 (float)uVar8 * fVar79 + (float)uVar7 * fVar78 + (float)uVar6 * fVar82;
    fStack_1044 = (float)uVar18 * fVar81 +
                  (float)uVar17 * fVar79 + (float)uVar16 * fVar78 + (float)uVar15 * fVar82;
    fStack_1040 = fVar81 * (float)uVar13 +
                  fVar79 * (float)uVar12 + fVar78 * (float)uVar11 + fVar82 * (float)uVar10;
    fStack_103c = fVar81 * (float)uVar22 +
                  fVar79 * (float)uVar21 + fVar78 * (float)uVar20 + fVar82 * (float)uVar19;
    lVar45 = (long)pcVar25 - (long)parsedData->meshes >> 3;
    if ((ulong)gpu::meshPrimsVaos._4096_8_ <= (ulong)(lVar45 * -0x71c71c71c71c71c7)) {
      __function = 
      "T &tl::FVector<unsigned int, 1024>::operator[](size_t) [T = unsigned int, N = 1024]";
LAB_00115ddd:
      __assert_fail("i < _size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tl/tl/containers/fvector.hpp"
                    ,0x42,__function);
    }
    pmVar28 = (mat4 *)pcVar25->primitives_count;
    parentMat = pmVar28;
    if (pmVar28 != (mat4 *)0x0) {
      skinning = (uint)(local_1210 != (cgltf_skin *)0x0);
      uVar23 = *(uint *)(gpu::meshPrimsVaos + lVar45 * 0x38e38e38e38e38e4);
      ppcVar41 = &pcVar25->primitives->attributes;
      pmVar47 = (mat4 *)0x0;
      do {
        pcVar40 = (cgltf_material *)ppcVar41[-1];
        if (pcVar40 == (cgltf_material *)0x0) {
          pcVar40 = &s_defaultMaterial;
        }
        if (pcVar40->has_pbr_metallic_roughness == 0) {
          __assert_fail("false && \"type of material not supported\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                        ,0x37a,
                        "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
                       );
        }
        GVar24 = *(GLuint *)(gpu::vaos + (long)pmVar47 * 4 + (ulong)uVar23 * 4);
        pSVar37 = gpu::shaderPbrMetallic(skinning);
        (*glad_debug_glUseProgram)(pSVar37->prog);
        (*glad_debug_glUniformMatrix4fv)((pSVar37->unifLocs).modelViewProj,1,'\0',&local_1078);
        (*glad_debug_glUniformMatrix3fv)((pSVar37->unifLocs).modelMat3,1,'\0',&local_1234);
        if (local_1210 != (cgltf_skin *)0x0) {
          (*glad_debug_glUniformMatrix4fv)
                    ((pSVar37->unifLocs).jointMatrices,local_1270,'\0',local_1038);
        }
        (*glad_debug_glActiveTexture)(0x84c0);
        p_Var34 = glad_debug_glUniform4fv;
        if (pcVar40->has_pbr_metallic_roughness != 0) {
          pSVar37 = gpu::shaderPbrMetallic(skinning);
          (*p_Var34)((pSVar37->unifLocs).color,1,(pcVar40->pbr_metallic_roughness).base_color_factor
                    );
          pcVar29 = (pcVar40->pbr_metallic_roughness).base_color_texture.texture;
          pGVar38 = &gpu::whiteTexture;
          if (pcVar29 == (cgltf_texture *)0x0) {
LAB_00115c57:
            (*glad_debug_glBindTexture)(0xde1,*pGVar38);
            goto LAB_00115c73;
          }
          lVar45 = (long)pcVar29 - (long)parsedData->textures >> 3;
          if ((ulong)(lVar45 * -0x3333333333333333) < DAT_003e8918) {
            pGVar38 = &gpu::textures + lVar45 * 0xccccccccccccccd;
            goto LAB_00115c57;
          }
LAB_00115dc8:
          __function = 
          "T &tl::FVector<unsigned int, 128>::operator[](size_t) [T = unsigned int, N = 128]";
          goto LAB_00115ddd;
        }
        if (pcVar40->has_pbr_specular_glossiness != 0) {
          __assert_fail("\"todo\" && false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                        ,0x354,
                        "auto drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)::(anonymous class)::operator()() const"
                       );
        }
LAB_00115c73:
        (*glad_debug_glActiveTexture)(0x84c1);
        pcVar29 = (pcVar40->normal_texture).texture;
        if (pcVar29 == (cgltf_texture *)0x0) {
          GVar42 = 0;
        }
        else {
          lVar45 = (long)pcVar29 - (long)parsedData->textures >> 3;
          if (DAT_003e8918 <= (ulong)(lVar45 * -0x3333333333333333)) goto LAB_00115dc8;
          GVar42 = (&gpu::textures)[lVar45 * 0xccccccccccccccd];
        }
        (*glad_debug_glBindTexture)(0xde1,GVar42);
        (*glad_debug_glBindVertexArray)(GVar24);
        p_Var33 = glad_debug_glDrawElements;
        p_Var32 = glad_debug_glDrawArrays;
        if ((cgltf_accessor *)ppcVar41[-2] == (cgltf_accessor *)0x0) {
          GVar35 = cgltfPrimTypeToGl(((cgltf_primitive *)(ppcVar41 + -3))->type);
          (*p_Var32)(GVar35,0,(GLsizei)(*ppcVar41)->data->count);
          parentMat = extraout_RDX_00;
        }
        else {
          GVar35 = cgltfPrimTypeToGl(((cgltf_primitive *)(ppcVar41 + -3))->type);
          cVar31 = ((cgltf_accessor *)ppcVar41[-2])->count;
          GVar36 = cgltfComponentTypeToGl(((cgltf_accessor *)ppcVar41[-2])->component_type);
          (*p_Var33)(GVar35,(GLsizei)cVar31,GVar36,
                     (void *)(((cgltf_accessor *)ppcVar41[-2])->offset +
                             ((cgltf_accessor *)ppcVar41[-2])->buffer_view->offset));
          parentMat = extraout_RDX;
        }
        pmVar47 = (mat4 *)((long)&pmVar47->value[0].field_0 + 1);
        ppcVar41 = ppcVar41 + 9;
      } while (pmVar28 != pmVar47);
    }
  }
  cVar31 = node->children_count;
  if (cVar31 != 0) {
    ppcVar30 = node->children;
    lVar45 = 0;
    do {
      node_00 = *(cgltf_node **)((long)ppcVar30 + lVar45);
      if (node_00 == (cgltf_node *)0x0) {
        __assert_fail("child",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x381,
                      "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
                     );
      }
      drawSceneNodeRecursive(node_00,viewProj,parentMat);
      lVar45 = lVar45 + 8;
      parentMat = extraout_RDX_01;
    } while (cVar31 << 3 != lVar45);
  }
  return;
}

Assistant:

static void drawSceneNodeRecursive(const cgltf_node& node, const glm::mat4& viewProj,
    const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const glm::mat4& modelMat = anims::nodesMatrices[nodeInd];

    if(node.mesh)
    {
        const int skinning = node.skin ? 1 : 0;
        int numJoints = 0;
        glm::mat4 jointMatrices[MAX_NUM_JOINTS];
        if(node.skin) {
            numJoints = node.skin->joints_count;
            const glm::mat4 modelMatInv = glm::affineInverse(modelMat);
            for(size_t i = 0; i < numJoints; i++) {
                const cgltf_node& joint = *node.skin->joints[i];
                const size_t jointNodeInd = getNodeInd(&joint);
                const glm::mat4& invBindMtx = *(const glm::mat4*)cgltfAccessAccessor(*node.skin->inverse_bind_matrices, i);
                jointMatrices[i] =
                    modelMatInv *
                    anims::nodesMatrices[jointNodeInd] *
                    invBindMtx;
            }
        }

        const glm::mat3 modelMat3 = modelMat;
        const glm::mat4 modelViewProj = viewProj * modelMat;
        CSpan<cgltf_primitive> primitives(node.mesh->primitives, node.mesh->primitives_count);
        const u32* vaos = gpu::vaos.begin() + gpu::meshPrimsVaos[getMeshInd(node.mesh)];
        for(size_t i = 0; i < primitives.size(); i++)
        {
            const cgltf_primitive& prim = primitives[i];
            const u32 vao = vaos[i];
            const auto& material = prim.material ? *prim.material : s_defaultMaterial;

            auto draw = [&]
            {
                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::ALBEDO);
                if(material.has_pbr_metallic_roughness) {
                    glUniform4fv(gpu::shaderPbrMetallic(skinning).unifLocs.color,
                                 1, material.pbr_metallic_roughness.base_color_factor);
                    if(auto tex = material.pbr_metallic_roughness.base_color_texture.texture)
                        glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                    else
                        glBindTexture(GL_TEXTURE_2D, gpu::whiteTexture);
                }
                else if(material.has_pbr_specular_glossiness) {
                    assert("todo" && false);
                }

                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::NORMAL);
                if(auto tex = material.normal_texture.texture)
                    glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                else
                    glBindTexture(GL_TEXTURE_2D, gpu::blueTexture);

                glBindVertexArray(vao);
                if(prim.indices) {
                    glDrawElements(
                       cgltfPrimTypeToGl(prim.type),
                       prim.indices->count,
                       cgltfComponentTypeToGl(prim.indices->component_type),
                       (void*)(prim.indices->buffer_view->offset + prim.indices->offset)
                    );
                }
                else {
                    glDrawArrays(cgltfPrimTypeToGl(prim.type), 0, prim.attributes->data->count);
                }
            };
            auto uploadCommonUniforms = [&](const ShaderData& shader)
            {
                glUniformMatrix4fv(shader.unifLocs.modelViewProj, 1, GL_FALSE, &modelViewProj[0][0]);
                glUniformMatrix3fv(shader.unifLocs.modelMat3, 1, GL_FALSE, &modelMat3[0][0]);
                if(skinning)
                    glUniformMatrix4fv(shader.unifLocs.jointMatrices, numJoints, GL_FALSE, &jointMatrices[0][0][0]);
            };

            if(material.has_pbr_metallic_roughness)
            {
                auto& shader = gpu::shaderPbrMetallic(skinning);
                glUseProgram(shader.prog);
                uploadCommonUniforms(shader);
                draw();
            }
            else {
                assert(false && "type of material not supported");
            }
        }
    }

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        drawSceneNodeRecursive(*child, viewProj, modelMat);
    }
}